

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int nlohmann::json_abi_v3_11_3::detail::dtoa_impl::find_largest_pow10(uint32_t n,uint32_t *pow10)

{
  uint32_t *pow10_local;
  uint32_t n_local;
  
  if (n < 1000000000) {
    if (n < 100000000) {
      if (n < 10000000) {
        if (n < 1000000) {
          if (n < 100000) {
            if (n < 10000) {
              if (n < 1000) {
                if (n < 100) {
                  if (n < 10) {
                    *pow10 = 1;
                    pow10_local._4_4_ = 1;
                  }
                  else {
                    *pow10 = 10;
                    pow10_local._4_4_ = 2;
                  }
                }
                else {
                  *pow10 = 100;
                  pow10_local._4_4_ = 3;
                }
              }
              else {
                *pow10 = 1000;
                pow10_local._4_4_ = 4;
              }
            }
            else {
              *pow10 = 10000;
              pow10_local._4_4_ = 5;
            }
          }
          else {
            *pow10 = 100000;
            pow10_local._4_4_ = 6;
          }
        }
        else {
          *pow10 = 1000000;
          pow10_local._4_4_ = 7;
        }
      }
      else {
        *pow10 = 10000000;
        pow10_local._4_4_ = 8;
      }
    }
    else {
      *pow10 = 100000000;
      pow10_local._4_4_ = 9;
    }
  }
  else {
    *pow10 = 1000000000;
    pow10_local._4_4_ = 10;
  }
  return pow10_local._4_4_;
}

Assistant:

inline int find_largest_pow10(const std::uint32_t n, std::uint32_t& pow10)
{
    // LCOV_EXCL_START
    if (n >= 1000000000)
    {
        pow10 = 1000000000;
        return 10;
    }
    // LCOV_EXCL_STOP
    if (n >= 100000000)
    {
        pow10 = 100000000;
        return  9;
    }
    if (n >= 10000000)
    {
        pow10 = 10000000;
        return  8;
    }
    if (n >= 1000000)
    {
        pow10 = 1000000;
        return  7;
    }
    if (n >= 100000)
    {
        pow10 = 100000;
        return  6;
    }
    if (n >= 10000)
    {
        pow10 = 10000;
        return  5;
    }
    if (n >= 1000)
    {
        pow10 = 1000;
        return  4;
    }
    if (n >= 100)
    {
        pow10 = 100;
        return  3;
    }
    if (n >= 10)
    {
        pow10 = 10;
        return  2;
    }

    pow10 = 1;
    return 1;
}